

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

BayesianGameIdenticalPayoff *
BayesianGameIdenticalPayoff::LoadTextFormat
          (BayesianGameIdenticalPayoff *__return_storage_ptr__,string *filename)

{
  ostream *poVar1;
  istream *piVar2;
  size_t sVar3;
  size_t sVar4;
  E *pEVar5;
  uint i;
  size_t sVar6;
  double tempDouble;
  size_t nrAgents;
  long local_510;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrActions;
  size_t tempInt;
  string buffer;
  ifstream fp;
  byte abStack_480 [488];
  BayesianGameIdenticalPayoff local_298;
  istringstream is;
  
  std::ifstream::ifstream(&fp,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_480[*(long *)(_fp + -0x18)] & 5) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "BayesianGameIdenticalPayoff::LoadTextFormat: failed to ");
    poVar1 = std::operator<<(poVar1,"open file ");
    poVar1 = std::operator<<(poVar1,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempInt = 0;
  nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BayesianGameIdenticalPayoff(__return_storage_ptr__);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  local_510 = 0;
  sVar6 = 0;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&fp,(string *)&buffer);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 2) != 0) {
      sVar4 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
      if (sVar4 != sVar6) {
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,
             "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint types in utility function"
            );
        __cxa_throw(pEVar5,&E::typeinfo,E::~E);
      }
      __return_storage_ptr__->_m_initialized = true;
      std::__cxx11::string::~string((string *)&buffer);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::ifstream::~ifstream(&fp);
      return __return_storage_ptr__;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
    switch(local_510) {
    case 0:
      break;
    case 1:
      std::istream::_M_extract<unsigned_long>((ulong *)&is);
      break;
    case 2:
      while (piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)&is),
            ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&nrActions,&tempInt);
      }
      if ((long)nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != 0) {
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,"BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions");
LAB_003f3044:
        __cxa_throw(pEVar5,&E::typeinfo,E::~E);
      }
      break;
    case 3:
      while (piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)&is),
            ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&nrTypes,&tempInt);
      }
      if ((long)nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != 0) {
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,"BayesianGameIdenticalPayoff::LoadTextFormat wrong number of types");
        goto LAB_003f3044;
      }
      BayesianGameIdenticalPayoff(&local_298,0,&nrActions,&nrTypes,false);
      operator=(__return_storage_ptr__,&local_298);
      ~BayesianGameIdenticalPayoff(&local_298);
      break;
    case 4:
      i = 0;
      while (piVar2 = std::istream::_M_extract<double>((double *)&is),
            ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
        BayesianGameBase::SetProbability((BayesianGameBase *)__return_storage_ptr__,i,0.0);
        i = i + 1;
      }
      sVar4 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)__return_storage_ptr__);
      sVar6 = 0;
      if (sVar4 != i) {
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,
             "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint type probabilities")
        ;
        goto LAB_003f3044;
      }
      break;
    default:
      sVar4 = 0;
      while( true ) {
        piVar2 = std::istream::_M_extract<double>((double *)&is);
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        (*(__return_storage_ptr__->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                  (0,__return_storage_ptr__->_m_utilFunction,sVar6,sVar4);
        sVar4 = (size_t)((int)sVar4 + 1);
      }
      sVar3 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)__return_storage_ptr__);
      if (sVar3 != sVar4) {
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar5,
             "BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions in utility function"
            );
        goto LAB_003f3044;
      }
      sVar6 = (size_t)((int)sVar6 + 1);
    }
    local_510 = local_510 + 1;
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  } while( true );
}

Assistant:

BayesianGameIdenticalPayoff BayesianGameIdenticalPayoff::LoadTextFormat(const string &filename)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "BayesianGameIdenticalPayoff::LoadTextFormat: failed to "
             << "open file " << filename << endl;            
    }

    size_t nrAgents=0;
    vector<size_t> nrActions, nrTypes;

    size_t tempInt=0;
    double tempDouble=0;
    size_t lineNumber=0;
    BayesianGameIdenticalPayoff bg;
    Index jtI=0,jaI=0;

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        switch(lineNumber)
        {
        case 0:
            // skip first line (header)
            break;
        case 1:
            is >> nrAgents;
            break;
        case 2:
            while(is >> tempInt)
                nrActions.push_back(tempInt);
            if(nrActions.size()!=nrAgents)
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions"));
            break;
        case 3:
            while(is >> tempInt)
                nrTypes.push_back(tempInt);
            if(nrTypes.size()!=nrAgents)
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of types"));

            // now we have all the info to instantiate the BG
            bg=BayesianGameIdenticalPayoff(nrAgents,nrActions,nrTypes);
            break;
        case 4:
            jtI=0;
            while(is >> tempDouble)
            {
                bg.SetProbability(jtI,tempDouble);
                jtI++;
            }
            if(jtI!=bg.GetNrJointTypes())
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint type probabilities"));
            jtI=0;
            break;
        default:
            jaI=0;
            while(is >> tempDouble)
            {
                bg.SetUtility(jtI,jaI,tempDouble);
                jaI++;
            }
            if(jaI!=bg.GetNrJointActions())
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions in utility function"));
            jtI++;
            break;
        }

        lineNumber++;
    }
        
    if(jtI!=bg.GetNrJointTypes())
        throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint types in utility function"));

    bg.SetInitialized(true);

    return(bg);
}